

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool __thiscall kj::StringPtr::endsWith(StringPtr *this,StringPtr *other)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = (other->content).size_;
  uVar2 = (this->content).size_;
  if (uVar2 < uVar1) {
    return false;
  }
  iVar3 = bcmp((this->content).ptr + (uVar2 - uVar1),(other->content).ptr,uVar1 - 1);
  return iVar3 == 0;
}

Assistant:

inline bool StringPtr::endsWith(const StringPtr& other) const {
  return other.content.size() <= content.size() &&
      memcmp(end() - other.size(), other.content.begin(), other.size()) == 0;
}